

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZArc3D::ComputeR2Points
          (TPZArc3D *this,TPZFMatrix<double> *coord,double *xa,double *ya,double *xb,double *yb)

{
  double dVar1;
  double *pdVar2;
  double *ya_00;
  double *pdVar3;
  TPZManVector<double,_3> *this_00;
  double *in_RCX;
  double *in_RDX;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double dVar4;
  int j;
  int i;
  TPZManVector<double,_3> Temp;
  TPZManVector<double,_3> Axe;
  double in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  TPZFMatrix<double> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  TPZManVector<double,_3> *in_stack_fffffffffffffe90;
  int64_t in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  TPZVec<double> *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  TPZFMatrix<double> *in_stack_fffffffffffffed0;
  TPZArc3D *in_stack_fffffffffffffed8;
  int local_c4;
  int local_c0;
  TPZVec<double> local_a8;
  undefined8 local_70;
  TPZVec<double> local_68;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  
  local_70 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(double *)in_stack_fffffffffffffe80
            );
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(double *)in_stack_fffffffffffffe80
            );
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                        (int64_t)in_stack_fffffffffffffe70);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                        (int64_t)in_stack_fffffffffffffe70);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_68,(long)local_c0);
    *pdVar2 = dVar4 - dVar1;
  }
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                          (int64_t)in_stack_fffffffffffffe70);
      dVar4 = *pdVar2;
      pdVar2 = TPZVec<double>::operator[](&local_68,(long)local_c4);
      in_stack_fffffffffffffed0 = (TPZFMatrix<double> *)*pdVar2;
      in_stack_fffffffffffffed8 = (TPZArc3D *)TPZVec<double>::operator[](&local_a8,(long)local_c0);
      (in_stack_fffffffffffffed8->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.
      super_TPZSavable._vptr_TPZSavable =
           (_func_int **)
           (dVar4 * (double)in_stack_fffffffffffffed0 +
           (double)(in_stack_fffffffffffffed8->super_TPZNodeRep<3,_pztopology::TPZLine>).
                   super_TPZLine.super_TPZSavable._vptr_TPZSavable);
    }
  }
  pdVar2 = TPZVec<double>::operator[](&local_a8,0);
  *local_18 = *pdVar2;
  ya_00 = TPZVec<double>::operator[](&local_a8,1);
  *local_20 = *ya_00;
  TPZVec<double>::Fill
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    in_stack_fffffffffffffeb8 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                    (int64_t)in_stack_fffffffffffffe70);
    dVar4 = *in_stack_fffffffffffffeb8;
    in_stack_fffffffffffffeb0 =
         (TPZVec<double> *)
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                    (int64_t)in_stack_fffffffffffffe70);
    dVar4 = dVar4 - (double)in_stack_fffffffffffffeb0->_vptr_TPZVec;
    pdVar3 = TPZVec<double>::operator[](&local_68,(long)local_c0);
    *pdVar3 = dVar4;
  }
  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe80,(int64_t)in_stack_fffffffffffffe78,
                          (int64_t)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe80 = (TPZFMatrix<double> *)*pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_68,(long)local_c4);
      in_stack_fffffffffffffe70 = *pdVar3;
      in_stack_fffffffffffffe78 = TPZVec<double>::operator[](&local_a8,(long)local_c0);
      *in_stack_fffffffffffffe78 =
           (double)in_stack_fffffffffffffe80 * in_stack_fffffffffffffe70 +
           *in_stack_fffffffffffffe78;
    }
  }
  pdVar3 = TPZVec<double>::operator[](&local_a8,0);
  *local_28 = *pdVar3;
  this_00 = (TPZManVector<double,_3> *)TPZVec<double>::operator[](&local_a8,1);
  *local_30 = (double)(this_00->super_TPZVec<double>)._vptr_TPZVec;
  dVar4 = ArcAngle(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,(double)pdVar2,(double)ya_00,
                   (double)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0);
  *(double *)(in_RDI + 0x250) = dVar4;
  TPZManVector<double,_3>::~TPZManVector(this_00);
  TPZManVector<double,_3>::~TPZManVector(this_00);
  return;
}

Assistant:

void TPZArc3D::ComputeR2Points(TPZFMatrix<REAL> &coord, double &xa, double &ya, double &xb, double &yb)
{
	/** vector (ini - middle) written in new R2 base */
	TPZManVector<REAL,3> Axe(3,0.), Temp(3,0.);
	int i, j;
	for(i = 0; i < 3; i++) Axe[i] = coord(i,0) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xa = Temp[0]; ya = Temp[1];
	Temp.Fill(0.);
	
	/** vector (final - middle) written in new R2 base */
	for(i = 0; i < 3; i++) Axe[i] = coord(i,1) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xb = Temp[0]; yb = Temp[1];
	
	fAngle = ArcAngle(coord,xa, ya, xb, yb);
}